

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_free_modules(JSContext *ctx,JSFreeModuleEnum flag)

{
  char cVar1;
  list_head *plVar2;
  list_head *plVar3;
  
  plVar2 = (ctx->loaded_modules).next;
joined_r0x00118cbc:
  plVar3 = plVar2;
  if (plVar3 == &ctx->loaded_modules) {
    return;
  }
  plVar2 = plVar3->next;
  if (flag != JS_FREE_MODULE_ALL) {
    if (flag != JS_FREE_MODULE_NOT_EVALUATED) goto code_r0x00118cd4;
    cVar1 = *(char *)((long)&plVar3[7].next + 3);
    goto joined_r0x00118ce5;
  }
  goto LAB_00118ce7;
code_r0x00118cd4:
  if (flag == JS_FREE_MODULE_NOT_RESOLVED) {
    cVar1 = *(char *)&plVar3[7].next;
joined_r0x00118ce5:
    if (cVar1 == '\0') {
LAB_00118ce7:
      js_free_module_def(ctx,(JSModuleDef *)&plVar3[-1].next);
    }
  }
  goto joined_r0x00118cbc;
}

Assistant:

static void js_free_modules(JSContext *ctx, JSFreeModuleEnum flag)
{
    struct list_head *el, *el1;
    list_for_each_safe(el, el1, &ctx->loaded_modules) {
        JSModuleDef *m = list_entry(el, JSModuleDef, link);
        if (flag == JS_FREE_MODULE_ALL ||
            (flag == JS_FREE_MODULE_NOT_RESOLVED && !m->resolved) ||
            (flag == JS_FREE_MODULE_NOT_EVALUATED && !m->evaluated)) {
            js_free_module_def(ctx, m);
        }
    }
}